

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_tri_pass(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_tri;
  REF_BOOL has_edg;
  REF_BOOL allowed;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node = (REF_NODE)ref_grid;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2de,
           "ref_swap_tri_pass","only twod/surf");
    ref_grid_local._4_4_ = 1;
  }
  else {
    uVar1 = ref_edge_create((REF_EDGE *)&node0,ref_grid);
    if (uVar1 == 0) {
      for (node1 = 0; node1 < _node0->n; node1 = node1 + 1) {
        allowed = _node0->e2n[node1 << 1];
        has_edg = _node0->e2n[node1 * 2 + 1];
        uVar1 = ref_cell_has_side((REF_CELL)ref_node->global,allowed,has_edg,
                                  &ref_private_macro_code_rss);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x2e6,"ref_swap_tri_pass",(ulong)uVar1,"has edg");
          return uVar1;
        }
        if (ref_private_macro_code_rss == 0) {
          uVar1 = ref_cell_has_side((REF_CELL)ref_node->part,allowed,has_edg,
                                    &ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x2ea,"ref_swap_tri_pass",(ulong)uVar1,"still triangle side");
            return uVar1;
          }
          if ((ref_private_macro_code_rss_1 != 0) &&
             (((ref_edge[2].adj)->nitem == ref_edge[1].e2n[allowed] ||
              ((ref_edge[2].adj)->nitem == ref_edge[1].e2n[has_edg])))) {
            uVar1 = ref_swap_edge_mixed((REF_GRID)ref_node,allowed,has_edg,&has_tri);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x2f1,"ref_swap_tri_pass",(ulong)uVar1,"faceid");
              return uVar1;
            }
            if (has_tri != 0) {
              uVar1 = ref_swap_same_faceid((REF_GRID)ref_node,allowed,has_edg,&has_tri);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0x2f3,"ref_swap_tri_pass",(ulong)uVar1,"faceid");
                return uVar1;
              }
              if (has_tri != 0) {
                uVar1 = ref_swap_manifold((REF_GRID)ref_node,allowed,has_edg,&has_tri);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x2f5,"ref_swap_tri_pass",(ulong)uVar1,"manifold");
                  return uVar1;
                }
                if (has_tri != 0) {
                  uVar1 = ref_swap_geom_topo((REF_GRID)ref_node,allowed,has_edg,&has_tri);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x2f7,"ref_swap_tri_pass",(ulong)uVar1,"topo");
                    return uVar1;
                  }
                  if (has_tri != 0) {
                    uVar1 = ref_swap_quality((REF_GRID)ref_node,allowed,has_edg,&has_tri);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                             ,0x2f9,"ref_swap_tri_pass",(ulong)uVar1,"qual");
                      return uVar1;
                    }
                    if (has_tri != 0) {
                      uVar1 = ref_swap_ratio((REF_GRID)ref_node,allowed,has_edg,&has_tri);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                               ,0x2fb,"ref_swap_tri_pass",(ulong)uVar1,"ratio");
                        return uVar1;
                      }
                      if (has_tri != 0) {
                        if (*(int *)((long)&ref_node[1].old_n_global + 4) == 0) {
                          uVar1 = ref_swap_outward_norm((REF_GRID)ref_node,allowed,has_edg,&has_tri)
                          ;
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                   ,0x301,"ref_swap_tri_pass",(ulong)uVar1,"area");
                            return uVar1;
                          }
                        }
                        else {
                          uVar1 = ref_swap_conforming((REF_GRID)ref_node,allowed,has_edg,&has_tri);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                   ,0x2fe,"ref_swap_tri_pass",(ulong)uVar1,"normdev");
                            return uVar1;
                          }
                        }
                        if (has_tri != 0) {
                          uVar1 = ref_swap_local_cell((REF_GRID)ref_node,allowed,has_edg,&has_tri);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                   ,0x305,"ref_swap_tri_pass",(ulong)uVar1,"local");
                            return uVar1;
                          }
                          if (has_tri == 0) {
                            (&(ref_edge[1].adj)->nnode)[allowed] =
                                 (&(ref_edge[1].adj)->nnode)[allowed] + 1;
                            (&(ref_edge[1].adj)->nnode)[has_edg] =
                                 (&(ref_edge[1].adj)->nnode)[has_edg] + 1;
                          }
                          else {
                            uVar1 = ref_swap_tri_edge((REF_GRID)ref_node,allowed,has_edg);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                                     ,0x30c,"ref_swap_tri_pass",(ulong)uVar1,"swap");
                              return uVar1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      ref_edge_free(_node0);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2e0,
             "ref_swap_tri_pass",(ulong)uVar1,"orig edges");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_tri_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_BOOL allowed, has_edg, has_tri;

  RAS(ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid), "only twod/surf");

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
        "has edg");
    if (has_edg) continue;

    RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
        "still triangle side");
    if (!has_tri) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
      continue;

    RSS(ref_swap_edge_mixed(ref_grid, node0, node1, &allowed), "faceid");
    if (!allowed) continue;
    RSS(ref_swap_same_faceid(ref_grid, node0, node1, &allowed), "faceid");
    if (!allowed) continue;
    RSS(ref_swap_manifold(ref_grid, node0, node1, &allowed), "manifold");
    if (!allowed) continue;
    RSS(ref_swap_geom_topo(ref_grid, node0, node1, &allowed), "topo");
    if (!allowed) continue;
    RSS(ref_swap_quality(ref_grid, node0, node1, &allowed), "qual");
    if (!allowed) continue;
    RSS(ref_swap_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed) continue;
    if (ref_grid_surf(ref_grid)) {
      RSS(ref_swap_conforming(ref_grid, node0, node1, &allowed), "normdev");
      if (!allowed) continue;
    } else {
      RSS(ref_swap_outward_norm(ref_grid, node0, node1, &allowed), "area");
      if (!allowed) continue;
    }

    RSS(ref_swap_local_cell(ref_grid, node0, node1, &allowed), "local");
    if (!allowed) {
      ref_node_age(ref_node, node0)++;
      ref_node_age(ref_node, node1)++;
      continue;
    }

    RSS(ref_swap_tri_edge(ref_grid, node0, node1), "swap");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}